

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O1

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int iVar1;
  Instruction *pIVar2;
  uint uVar3;
  
  if (e->k == VVARARG) {
    pIVar2 = fs->f->code;
    iVar1 = (e->u).info;
    uVar3 = nresults * 0x800000 + (pIVar2[iVar1] & 0x7fffff) + 0x800000;
    pIVar2[iVar1] = uVar3;
    pIVar2[iVar1] = (uint)fs->freereg << 6 | uVar3 & 0xffffc03f;
    luaK_checkstack(fs,1);
    fs->freereg = fs->freereg + '\x01';
  }
  else if (e->k == VCALL) {
    pIVar2 = fs->f->code;
    pIVar2[(e->u).info] = nresults * 0x4000 + 0x4000U & 0x7fc000 | pIVar2[(e->u).info] & 0xff803fff;
  }
  return;
}

Assistant:

void luaK_setreturns(FuncState *fs, expdesc *e, int nresults) {
    if (e->k == VCALL) {  /* expression is an open function call? */
        SETARG_C(getinstruction(fs, e), nresults + 1);
    } else if (e->k == VVARARG) {
        Instruction *pc = &getinstruction(fs, e);
        SETARG_B(*pc, nresults + 1);
        SETARG_A(*pc, fs->freereg);
        luaK_reserveregs(fs, 1);
    } else
        lua_assert(nresults == LUA_MULTRET);
}